

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

string * __thiscall
lest::to_string<nonstd::optional_lite::optional<int>,nonstd::optional_lite::optional<long>>
          (string *__return_storage_ptr__,lest *this,optional<int> *lhs,string *op,
          optional<long> *rhs)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostream *poVar2;
  optional<int> *value;
  optional<long> *value_00;
  ostringstream os;
  string local_208;
  char *local_1e8;
  long local_1e0;
  char local_1d8 [16];
  char *local_1c8;
  long local_1c0;
  char local_1b8 [16];
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  string_maker<nonstd::optional_lite::optional<int>>::to_string_abi_cxx11_
            (&local_208,(string_maker<nonstd::optional_lite::optional<int>> *)this,value);
  local_1c8 = local_1b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,local_208._M_dataplus._M_p,
             local_208._M_dataplus._M_p + local_208._M_string_length);
  paVar1 = &local_208.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar1) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_1c8,local_1c0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)*lhs,(long)lhs[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  string_maker<nonstd::optional_lite::optional<long>>::to_string_abi_cxx11_
            (&local_208,(string_maker<nonstd::optional_lite::optional<long>> *)op,value_00);
  local_1e8 = local_1d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,local_208._M_dataplus._M_p,
             local_208._M_dataplus._M_p + local_208._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar1) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_1e8,local_1e0);
  if (local_1e8 != local_1d8) {
    operator_delete(local_1e8);
  }
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8);
  }
  std::__cxx11::ostringstream::str();
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_208._M_dataplus._M_p,
             local_208._M_dataplus._M_p + local_208._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar1) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string( L const & lhs, std::string op, R const & rhs )
{
    std::ostringstream os; os << to_string( lhs ) << " " << op << " " << to_string( rhs ); return os.str();
}